

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Expression * __thiscall soul::StructuralParser::parseLogicalOr(StructuralParser *this)

{
  char *__s1;
  int iVar1;
  Constant *args_2;
  Expression *args_3;
  pool_ref<soul::AST::Expression> a;
  Context context;
  pool_ref<soul::AST::Expression> local_90;
  Context local_88;
  Value local_70;
  
  local_90.object = parseLogicalAnd(this);
  do {
    __s1 = (this->super_SOULTokeniser).currentType.text;
    if (__s1 != "||") {
      if (__s1 == (char *)0x0) {
        return &((TernaryOp *)local_90.object)->super_Expression;
      }
      iVar1 = strcmp(__s1,"||");
      if (iVar1 != 0) {
        return &((TernaryOp *)local_90.object)->super_Expression;
      }
    }
    local_88.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_88.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_88.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_88.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_88.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_88.parentScope = this->currentScope;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    soul::Value::Value(&local_70,true);
    args_2 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&this->allocator->pool,&local_88,&local_70);
    soul::Value::~Value(&local_70);
    args_3 = parseLogicalAnd(this);
    local_90.object =
         &PoolAllocator::
          allocate<soul::AST::TernaryOp,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::AST::Constant&,soul::AST::Expression&>
                    (&this->allocator->pool,&local_88,&local_90,args_2,args_3)->super_Expression;
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.location.sourceCode.object);
  } while( true );
}

Assistant:

AST::Expression& parseLogicalOr()
    {
        for (pool_ref<AST::Expression> a = parseLogicalAnd();;)
        {
            if (! matches (Operator::logicalOr))
                return a;

            auto context = getContext();
            skip();
            auto& trueBranch = allocate<AST::Constant> (context, Value (true));
            auto& falseBranch = parseLogicalAnd();
            a = allocate<AST::TernaryOp> (context, a, trueBranch, falseBranch);
        }
    }